

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  char *__s;
  Offset OVar1;
  undefined1 local_68 [8];
  Location loc;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  local_68 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  MakeUnique<wabt::GlobalModuleField,wabt::Location>
            ((wabt *)(loc.field_1.field2 + 8),(Location *)local_68);
  *(Type *)(loc.field_1._8_8_ + 0x60) = type;
  *(bool *)(loc.field_1._8_8_ + 100) = mutable_;
  local_38._M_head_impl = (GlobalModuleField *)loc.field_1._8_8_;
  loc.field_1._8_8_ = 0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (GlobalModuleField *)0x0;
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}